

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,token *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  string s;
  StringData sdata;
  string local_1e8;
  string local_1c8;
  StringData local_1a8 [2];
  ios_base local_138 [264];
  
  paVar1 = &local_1a8[0].value.field_2;
  local_1a8[0].value._M_string_length = 0;
  local_1a8[0].value.field_2._M_local_buf[0] = '\0';
  local_1a8[0].is_triple_quoted = false;
  local_1a8[0].single_quote = false;
  local_1a8[0].line_row = 0;
  local_1a8[0].line_col = 0;
  local_1a8[0].value._M_dataplus._M_p = (pointer)paVar1;
  bVar3 = MaybeTripleQuotedString(this,local_1a8);
  paVar2 = &local_1e8.field_2;
  if (bVar3) {
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    local_1e8._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_assign((string *)&local_1e8);
    ::std::__cxx11::string::operator=((string *)value,(string *)&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                               local_1e8.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0].value._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0].value._M_dataplus._M_p,
                    CONCAT71(local_1a8[0].value.field_2._M_allocated_capacity._1_7_,
                             local_1a8[0].value.field_2._M_local_buf[0]) + 1);
  }
  bVar4 = true;
  if (!bVar3) {
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    local_1e8._M_dataplus._M_p = (pointer)paVar2;
    bVar4 = ReadStringLiteral(this,&local_1e8);
    if (bVar4) {
      local_1a8[0].value._M_string_length = 0;
      local_1a8[0].value.field_2._M_local_buf[0] = '\0';
      local_1a8[0].value._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_assign((string *)local_1a8);
      ::std::__cxx11::string::operator=((string *)value,(string *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0].value._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0].value._M_dataplus._M_p,
                        CONCAT71(local_1a8[0].value.field_2._M_allocated_capacity._1_7_,
                                 local_1a8[0].value.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                 ,0x5f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[ASCII]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadBasicType",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x280);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Failed to parse string literal.",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      ::std::ios_base::~ios_base(local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                               local_1e8.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar4;
}

Assistant:

bool AsciiParser::ReadBasicType(value::token *value) {
  // Try triple-quotated string first.
  {
    value::StringData sdata;
    if (MaybeTripleQuotedString(&sdata)) {
      // TODO: preserve quotation info.
      (*value) = value::token(sdata.value);
      return true;
    }
  }

  std::string s;
  if (!ReadStringLiteral(&s)) {
    PUSH_ERROR_AND_RETURN_TAG(kAscii, "Failed to parse string literal.");
    return false;
  }

  (*value) = value::token(s);
  return true;
}